

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

int ws_listener_set_send_text(void *arg,void *buf,size_t sz,nni_type t)

{
  int iVar1;
  undefined8 in_RAX;
  _Bool local_21 [8];
  _Bool b;
  
  local_21[0] = SUB81((ulong)in_RAX >> 0x38,0);
  iVar1 = nni_copyin_bool(local_21,buf,sz,t);
  if (iVar1 == 0) {
    nni_mtx_lock((nni_mtx *)((long)arg + 0x60));
    *(_Bool *)((long)arg + 0x113) = local_21[0];
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
  }
  return iVar1;
}

Assistant:

static int
ws_listener_set_send_text(void *arg, const void *buf, size_t sz, nni_type t)
{
	nni_ws_listener *l = arg;
	int              rv;
	bool             b;

	if ((rv = nni_copyin_bool(&b, buf, sz, t)) == 0) {
		nni_mtx_lock(&l->mtx);
		l->send_text = b;
		nni_mtx_unlock(&l->mtx);
	}
	return (rv);
}